

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

bool check_user_password_V5(string *user_password,EncryptionData *data)

{
  __type_conflict1 _Var1;
  allocator<char> local_c9;
  string local_c8;
  string password;
  string validation_salt;
  string user_data;
  string local_48;
  
  std::__cxx11::string::substr((ulong)&user_data,(ulong)&data->U);
  std::__cxx11::string::substr((ulong)&validation_salt,(ulong)&data->U);
  truncate_password_V5(&password,user_password);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
  hash_V5(&local_48,&password,&validation_salt,&local_c8,data);
  _Var1 = std::operator==(&local_48,&user_data);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&password);
  std::__cxx11::string::~string((string *)&validation_salt);
  std::__cxx11::string::~string((string *)&user_data);
  return _Var1;
}

Assistant:

static bool
check_user_password_V5(std::string const& user_password, QPDF::EncryptionData const& data)
{
    // Algorithm 3.11 from the PDF 1.7 extension level 3

    std::string user_data = data.getU().substr(0, 32);
    std::string validation_salt = data.getU().substr(32, 8);
    std::string password = truncate_password_V5(user_password);
    return (hash_V5(password, validation_salt, "", data) == user_data);
}